

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::expand
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this)

{
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  void *pvVar2;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_RDI;
  size_t i;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *newStack;
  void *mem;
  size_t newCapacity;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  ulong local_28;
  
  if (*(long *)&(in_RDI->term).super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      == 0) {
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x8;
  }
  else {
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             (*(long *)&(in_RDI->term).super_PolyNfSuper._inner.
                        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                        .
                        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             << 1);
  }
  pMVar3 = pMVar1;
  pvVar2 = Lib::alloc((size_t)in_RDI);
  if (*(long *)&(in_RDI->term).super_PolyNfSuper._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      != 0) {
    for (local_28 = 0;
        local_28 <
        *(ulong *)&(in_RDI->term).super_PolyNfSuper._inner.
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   .
                   super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ; local_28 = local_28 + 1) {
      Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
                (in_RDI,pMVar3);
    }
    Lib::free(*(void **)((in_RDI->term).super_PolyNfSuper._inner.
                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         .
                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                         ._content + 7));
  }
  *(void **)((in_RDI->term).super_PolyNfSuper._inner.
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
             .
             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             ._content + 7) = pvVar2;
  *(long *)((in_RDI->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
            ._content + 0xf) =
       *(long *)((in_RDI->term).super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content + 7) +
       *(long *)&(in_RDI->term).super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
       * 0x1c;
  *(long *)&in_RDI->power =
       *(long *)((in_RDI->term).super_PolyNfSuper._inner.
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                 .
                 super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ._content + 7) + (long)pMVar1 * 0x1c;
  *(MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)
   &(in_RDI->term).super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
       = pMVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }